

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get<bool>
          (Attribute *this,double t,bool *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined1 local_2c [12];
  
  if (dst == (bool *)0x0) {
    return false;
  }
  if ((!NAN(t)) ||
     (((local_2c._4_8_ = t, (this->_var)._blocked == false &&
       (((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), t = (double)local_2c._4_8_, uVar3 == 0)) ||
        ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), t = (double)local_2c._4_8_, uVar3 == 1)))))) ||
      (primvar::PrimVar::get_value<bool>((PrimVar *)local_2c), t = (double)local_2c._4_8_,
      local_2c[0] != '\x01')))) {
    if ((this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = primvar::PrimVar::get_interpolated_value<bool>(&this->_var,t,tinterp,dst);
      return bVar2;
    }
    primvar::PrimVar::get_value<bool>((PrimVar *)(local_2c + 2));
    local_2c[1] = local_2c[3];
    if (local_2c[2] != '\x01') {
      return (bool)local_2c[2];
    }
  }
  *dst = (bool)local_2c[1];
  return true;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }